

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::AnchorEnd(void)

{
  int iVar1;
  allocator local_41;
  RegEx *in_stack_ffffffffffffffc0;
  RegEx *in_stack_ffffffffffffffc8;
  REGEX_OP in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  RegEx *in_stack_ffffffffffffffe0;
  
  if (AnchorEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&AnchorEnd()::e);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"?:,]}%@`",&local_41);
      RegEx::RegEx(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      BlankOrBreak();
      operator|(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      RegEx::~RegEx((RegEx *)0xf22672);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      __cxa_atexit(RegEx::~RegEx,&AnchorEnd::e,&__dso_handle);
      __cxa_guard_release(&AnchorEnd()::e);
    }
  }
  return &AnchorEnd::e;
}

Assistant:

inline const RegEx& AnchorEnd() {
  static const RegEx e = RegEx("?:,]}%@`", REGEX_OR) | BlankOrBreak();
  return e;
}